

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Led.cpp
# Opt level: O0

void __thiscall tiles::Led::cloneTo(Led *this,Chunk *chunk,uint tileIndex,Tile target)

{
  Chunk *ctx;
  uint in_EDX;
  Chunk *in_RSI;
  TileType *in_RDI;
  TileData *tileData;
  
  TileType::getTileData(in_RDI,in_RSI,in_EDX);
  ctx = Tile::getChunk((Tile *)&stack0x00000008);
  Tile::getIndex((Tile *)&stack0x00000008);
  init((Led *)in_RDI,(EVP_PKEY_CTX *)ctx);
  return;
}

Assistant:

void Led::cloneTo(const Chunk& chunk, unsigned int tileIndex, Tile target) {
    const auto& tileData = getTileData(chunk, tileIndex);
    init(target.getChunk(), target.getIndex(), tileData.state1);
}